

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

double ddCountPathsToNonZero(DdNode *N,st__table *table)

{
  DdNode *pDVar1;
  int iVar2;
  double *value;
  DdNode *N_00;
  DdNode *pDVar3;
  DdNode *pDVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *dummy;
  double *local_28;
  
  pDVar4 = (DdNode *)((ulong)N & 0xfffffffffffffffe);
  if (pDVar4->index == 0x7fffffff) {
    dVar5 = 0.0;
    if (((ulong)N & 1) == 0) {
      dVar5 = (double)(-(ulong)((pDVar4->type).value != 0.0) & 0x3ff0000000000000);
    }
  }
  else {
    iVar2 = st__lookup(table,(char *)N,(char **)&local_28);
    if (iVar2 == 0) {
      pDVar3 = (pDVar4->type).kids.T;
      pDVar1 = (pDVar4->type).kids.E;
      N_00 = (DdNode *)((ulong)pDVar3 ^ 1);
      if (pDVar4 == N) {
        N_00 = pDVar3;
      }
      dVar6 = ddCountPathsToNonZero(N_00,table);
      dVar5 = -1.0;
      if ((dVar6 != -1.0) || (NAN(dVar6))) {
        pDVar3 = (DdNode *)((ulong)pDVar1 ^ 1);
        if (pDVar4 == N) {
          pDVar3 = pDVar1;
        }
        dVar7 = ddCountPathsToNonZero(pDVar3,table);
        dVar5 = -1.0;
        if ((dVar7 != -1.0) || (NAN(dVar7))) {
          value = (double *)malloc(8);
          if (value != (double *)0x0) {
            *value = dVar6 + dVar7;
            iVar2 = st__add_direct(table,(char *)N,(char *)value);
            if (iVar2 != -10000) {
              return dVar6 + dVar7;
            }
            free(value);
          }
          dVar5 = -1.0;
        }
      }
    }
    else {
      dVar5 = *local_28;
    }
  }
  return dVar5;
}

Assistant:

static double
ddCountPathsToNonZero(
  DdNode * N,
  st__table * table)
{

    DdNode      *node, *Nt, *Ne;
    double      paths, *ppaths, paths1, paths2;
    double      *dummy;

    node = Cudd_Regular(N);
    if (cuddIsConstant(node)) {
        return((double) !(Cudd_IsComplement(N) || cuddV(node)==DD_ZERO_VAL));
    }
    if ( st__lookup(table, (const char *)N, (char **)&dummy)) {
        paths = *dummy;
        return(paths);
    }

    Nt = cuddT(node); Ne = cuddE(node);
    if (node != N) {
        Nt = Cudd_Not(Nt); Ne = Cudd_Not(Ne);
    }

    paths1 = ddCountPathsToNonZero(Nt,table);
    if (paths1 == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    paths2 = ddCountPathsToNonZero(Ne,table);
    if (paths2 == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    paths = paths1 + paths2;

    ppaths = ABC_ALLOC(double,1);
    if (ppaths == NULL) {
        return((double)CUDD_OUT_OF_MEM);
    }

    *ppaths = paths;

    if ( st__add_direct(table,(char *)N, (char *)ppaths) == st__OUT_OF_MEM) {
        ABC_FREE(ppaths);
        return((double)CUDD_OUT_OF_MEM);
    }
    return(paths);

}